

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_pcnt_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws)

{
  fpr_t *pfVar1;
  ushort uVar2;
  undefined1 auVar7 [12];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar3;
  undefined6 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar11 [16];
  
  auVar13 = *(undefined1 (*) [16])&(env->active_fpu).fpr[ws].fd;
  auVar14 = auVar13 & _DAT_00d83580;
  auVar10._0_2_ = auVar13._0_2_ >> 1;
  auVar10._2_2_ = auVar13._2_2_ >> 1;
  auVar10._4_2_ = auVar13._4_2_ >> 1;
  auVar10._6_2_ = auVar13._6_2_ >> 1;
  auVar10._8_2_ = auVar13._8_2_ >> 1;
  auVar10._10_2_ = auVar13._10_2_ >> 1;
  auVar10._12_2_ = auVar13._12_2_ >> 1;
  auVar10._14_2_ = auVar13._14_2_ >> 1;
  auVar10 = auVar10 & _DAT_00d83580;
  uVar2 = CONCAT11(auVar10[1] + auVar14[1],auVar10[0] + auVar14[0]);
  uVar3 = CONCAT13(auVar10[3] + auVar14[3],CONCAT12(auVar10[2] + auVar14[2],uVar2));
  uVar4 = CONCAT15(auVar10[5] + auVar14[5],CONCAT14(auVar10[4] + auVar14[4],uVar3));
  uVar5 = CONCAT17(auVar10[7] + auVar14[7],CONCAT16(auVar10[6] + auVar14[6],uVar4));
  auVar6._0_10_ = CONCAT19(auVar10[9] + auVar14[9],CONCAT18(auVar10[8] + auVar14[8],uVar5));
  auVar6[10] = auVar10[10] + auVar14[10];
  auVar6[0xb] = auVar10[0xb] + auVar14[0xb];
  auVar8[0xc] = auVar10[0xc] + auVar14[0xc];
  auVar8._0_12_ = auVar6;
  auVar8[0xd] = auVar10[0xd] + auVar14[0xd];
  auVar13[0xe] = auVar10[0xe] + auVar14[0xe];
  auVar13._0_14_ = auVar8;
  auVar13[0xf] = auVar10[0xf] + auVar14[0xf];
  auVar10 = auVar13 & _DAT_00d83590;
  auVar14._0_2_ = uVar2 >> 2;
  auVar14._2_2_ = (ushort)((uint)uVar3 >> 0x12);
  auVar14._4_2_ = (ushort)((uint6)uVar4 >> 0x22);
  auVar14._6_2_ = (ushort)((ulong)uVar5 >> 0x32);
  auVar14._8_2_ = (ushort)((unkuint10)auVar6._0_10_ >> 0x42);
  auVar14._10_2_ = auVar6._10_2_ >> 2;
  auVar14._12_2_ = auVar8._12_2_ >> 2;
  auVar14._14_2_ = auVar13._14_2_ >> 2;
  auVar14 = auVar14 & _DAT_00d83590;
  uVar2 = CONCAT11(auVar14[1] + auVar10[1],auVar14[0] + auVar10[0]);
  uVar3 = CONCAT13(auVar14[3] + auVar10[3],CONCAT12(auVar14[2] + auVar10[2],uVar2));
  uVar4 = CONCAT15(auVar14[5] + auVar10[5],CONCAT14(auVar14[4] + auVar10[4],uVar3));
  uVar5 = CONCAT17(auVar14[7] + auVar10[7],CONCAT16(auVar14[6] + auVar10[6],uVar4));
  auVar7._0_10_ = CONCAT19(auVar14[9] + auVar10[9],CONCAT18(auVar14[8] + auVar10[8],uVar5));
  auVar7[10] = auVar14[10] + auVar10[10];
  auVar7[0xb] = auVar14[0xb] + auVar10[0xb];
  auVar9[0xc] = auVar14[0xc] + auVar10[0xc];
  auVar9._0_12_ = auVar7;
  auVar9[0xd] = auVar14[0xd] + auVar10[0xd];
  auVar11[0xe] = auVar14[0xe] + auVar10[0xe];
  auVar11._0_14_ = auVar9;
  auVar11[0xf] = auVar14[0xf] + auVar10[0xf];
  auVar13 = _DAT_00d835a0 & auVar11;
  auVar12._0_2_ = uVar2 >> 4;
  auVar12._2_2_ = (ushort)((uint)uVar3 >> 0x14);
  auVar12._4_2_ = (ushort)((uint6)uVar4 >> 0x24);
  auVar12._6_2_ = (ushort)((ulong)uVar5 >> 0x34);
  auVar12._8_2_ = (ushort)((unkuint10)auVar7._0_10_ >> 0x44);
  auVar12._10_2_ = auVar7._10_2_ >> 4;
  auVar12._12_2_ = auVar9._12_2_ >> 4;
  auVar12._14_2_ = auVar11._14_2_ >> 4;
  auVar12 = auVar12 & _DAT_00d835b0;
  pfVar1 = (env->active_fpu).fpr + wd;
  *(char *)pfVar1 = auVar12[0] + auVar13[0];
  *(char *)((long)pfVar1 + 1) = auVar12[1] + auVar13[1];
  *(char *)((long)pfVar1 + 2) = auVar12[2] + auVar13[2];
  *(char *)((long)pfVar1 + 3) = auVar12[3] + auVar13[3];
  *(char *)((long)pfVar1 + 4) = auVar12[4] + auVar13[4];
  *(char *)((long)pfVar1 + 5) = auVar12[5] + auVar13[5];
  *(char *)((long)pfVar1 + 6) = auVar12[6] + auVar13[6];
  *(char *)((long)pfVar1 + 7) = auVar12[7] + auVar13[7];
  *(char *)((long)pfVar1 + 8) = auVar12[8] + auVar13[8];
  *(char *)((long)pfVar1 + 9) = auVar12[9] + auVar13[9];
  *(char *)((long)pfVar1 + 10) = auVar12[10] + auVar13[10];
  *(char *)((long)pfVar1 + 0xb) = auVar12[0xb] + auVar13[0xb];
  *(char *)((long)pfVar1 + 0xc) = auVar12[0xc] + auVar13[0xc];
  *(char *)((long)pfVar1 + 0xd) = auVar12[0xd] + auVar13[0xd];
  *(char *)((long)pfVar1 + 0xe) = auVar12[0xe] + auVar13[0xe];
  *(char *)((long)pfVar1 + 0xf) = auVar12[0xf] + auVar13[0xf];
  return;
}

Assistant:

void helper_msa_pcnt_b(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->b[0]  = msa_pcnt_df(DF_BYTE, pws->b[0]);
    pwd->b[1]  = msa_pcnt_df(DF_BYTE, pws->b[1]);
    pwd->b[2]  = msa_pcnt_df(DF_BYTE, pws->b[2]);
    pwd->b[3]  = msa_pcnt_df(DF_BYTE, pws->b[3]);
    pwd->b[4]  = msa_pcnt_df(DF_BYTE, pws->b[4]);
    pwd->b[5]  = msa_pcnt_df(DF_BYTE, pws->b[5]);
    pwd->b[6]  = msa_pcnt_df(DF_BYTE, pws->b[6]);
    pwd->b[7]  = msa_pcnt_df(DF_BYTE, pws->b[7]);
    pwd->b[8]  = msa_pcnt_df(DF_BYTE, pws->b[8]);
    pwd->b[9]  = msa_pcnt_df(DF_BYTE, pws->b[9]);
    pwd->b[10] = msa_pcnt_df(DF_BYTE, pws->b[10]);
    pwd->b[11] = msa_pcnt_df(DF_BYTE, pws->b[11]);
    pwd->b[12] = msa_pcnt_df(DF_BYTE, pws->b[12]);
    pwd->b[13] = msa_pcnt_df(DF_BYTE, pws->b[13]);
    pwd->b[14] = msa_pcnt_df(DF_BYTE, pws->b[14]);
    pwd->b[15] = msa_pcnt_df(DF_BYTE, pws->b[15]);
}